

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlResolvePath(xmlChar *escRef,xmlChar *base,xmlChar **out)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *path;
  bool bVar3;
  int local_50;
  int refLen;
  int i;
  int ret;
  xmlChar *result;
  xmlChar *ref;
  xmlChar *tmp;
  xmlChar *fragment;
  xmlChar **out_local;
  xmlChar *base_local;
  xmlChar *escRef_local;
  
  ref = (xmlChar *)0x0;
  result = (xmlChar *)0x0;
  _i = (xmlChar *)0x0;
  refLen = -1;
  if (out == (xmlChar **)0x0) {
    return 1;
  }
  *out = (xmlChar *)0x0;
  if ((escRef == (xmlChar *)0x0) || (*escRef == '\0')) {
    if ((base == (xmlChar *)0x0) || (*base == '\0')) {
      return 1;
    }
    pxVar2 = xmlStrdup(base);
    if (pxVar2 != (xmlChar *)0x0) {
      *out = pxVar2;
      return 0;
    }
    result = (xmlChar *)0x0;
  }
  else {
    pxVar2 = xmlStrchr(escRef,'#');
    base_local = escRef;
    if (((pxVar2 == (xmlChar *)0x0) ||
        (ref = xmlStrndup(escRef,(int)pxVar2 - (int)escRef), base_local = ref, ref != (xmlChar *)0x0
        )) && (path = (xmlChar *)xmlURIUnescapeString((char *)base_local,-1,(char *)0x0),
              result = path, path != (xmlChar *)0x0)) {
      if (((base != (xmlChar *)0x0) && (*base != '\0')) &&
         (iVar1 = xmlIsAbsolutePath(path), iVar1 == 0)) {
        local_50 = xmlStrlen(base);
        while( true ) {
          bVar3 = false;
          if (0 < local_50) {
            iVar1 = xmlIsPathSeparator((uint)base[local_50 + -1],1);
            bVar3 = iVar1 == 0;
          }
          if (!bVar3) break;
          local_50 = local_50 + -1;
        }
        if (0 < local_50) {
          iVar1 = xmlStrlen(path);
          _i = (xmlChar *)(*xmlMalloc)((long)(local_50 + iVar1 + 1));
          if (_i == (xmlChar *)0x0) goto LAB_001712aa;
          memcpy(_i,base,(long)local_50);
          memcpy(_i + local_50,path,(long)(iVar1 + 1));
        }
        xmlNormalizePath((char *)_i,1);
      }
      if (_i == (xmlChar *)0x0) {
        result = (xmlChar *)0x0;
        _i = path;
      }
      if ((pxVar2 == (xmlChar *)0x0) || (_i = xmlStrcat(_i,pxVar2), _i != (xmlChar *)0x0)) {
        *out = _i;
        refLen = 0;
      }
    }
  }
LAB_001712aa:
  (*xmlFree)(ref);
  (*xmlFree)(result);
  return refLen;
}

Assistant:

static int
xmlResolvePath(const xmlChar *escRef, const xmlChar *base, xmlChar **out) {
    const xmlChar *fragment;
    xmlChar *tmp = NULL;
    xmlChar *ref = NULL;
    xmlChar *result = NULL;
    int ret = -1;
    int i;

    if (out == NULL)
        return(1);
    *out = NULL;

    if ((escRef == NULL) || (escRef[0] == 0)) {
        if ((base == NULL) || (base[0] == 0))
            return(1);
        ref = xmlStrdup(base);
        if (ref == NULL)
            goto err_memory;
        *out = ref;
        return(0);
    }

    /*
     * If a URI is resolved, we can assume it is a valid URI and not
     * a filesystem path. This means we have to unescape the part
     * before the fragment.
     */
    fragment = xmlStrchr(escRef, '#');
    if (fragment != NULL) {
        tmp = xmlStrndup(escRef, fragment - escRef);
        if (tmp == NULL)
            goto err_memory;
        escRef = tmp;
    }

    ref = (xmlChar *) xmlURIUnescapeString((char *) escRef, -1, NULL);
    if (ref == NULL)
        goto err_memory;

    if ((base == NULL) || (base[0] == 0))
        goto done;

    if (xmlIsAbsolutePath(ref))
        goto done;

    /*
     * Remove last segment from base
     */
    i = xmlStrlen(base);
    while ((i > 0) && !xmlIsPathSeparator(base[i-1], 1))
        i--;

    /*
     * Concatenate base and ref
     */
    if (i > 0) {
        int refLen = xmlStrlen(ref);

        result = xmlMalloc(i + refLen + 1);
        if (result == NULL)
            goto err_memory;

        memcpy(result, base, i);
        memcpy(result + i, ref, refLen + 1);
    }

    /*
     * Normalize
     */
    xmlNormalizePath((char *) result, 1);

done:
    if (result == NULL) {
        result = ref;
        ref = NULL;
    }

    if (fragment != NULL) {
        result = xmlStrcat(result, fragment);
        if (result == NULL)
            goto err_memory;
    }

    *out = result;
    ret = 0;

err_memory:
    xmlFree(tmp);
    xmlFree(ref);
    return(ret);
}